

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::TokenizeWindowsCommandLine
          (cl *this,StringRef Src,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
          bool MarkEOLs)

{
  StringRef Src_00;
  StringRef Src_01;
  ulong uVar1;
  int iVar2;
  size_t I;
  char *Index;
  size_t E;
  StringRef S;
  StringRef SVar3;
  char C;
  char *local_e8;
  undefined4 local_dc;
  StringRef Src_local;
  SmallString<128U> Token;
  
  local_dc = SUB84(NewArgv,0);
  Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &Token.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
  Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  Index = (char *)0x0;
  iVar2 = 0;
  Src_local.Data = (char *)this;
  Src_local.Length = (size_t)Src.Data;
  do {
    if (Index == Src.Data) {
      if (Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
          super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
          super_SmallVectorBase.Size != 0) {
        SVar3.Length._0_4_ =
             Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
             super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
             super_SmallVectorBase.Size;
        SVar3.Data = (char *)Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX;
        SVar3.Length._4_4_ = 0;
        SVar3 = StringSaver::save((StringSaver *)Src.Length,SVar3);
        local_e8 = SVar3.Data;
        SmallVectorTemplateBase<const_char_*,_true>::push_back
                  ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e8);
      }
      if ((char)local_dc != '\0') {
        local_e8 = (char *)0x0;
        SmallVectorTemplateBase<const_char_*,_true>::push_back
                  ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e8);
      }
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&Token);
      return;
    }
    C = StringRef::operator[](&Src_local,(size_t)Index);
    uVar1 = (ulong)(byte)C;
    if (iVar2 == 1) {
      if ((byte)C < 0x23) {
        if ((0x100002600U >> (uVar1 & 0x3f) & 1) != 0) {
          S.Length._0_4_ =
               Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.Size;
          S.Data = (char *)Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          S.Length._4_4_ = 0;
          SVar3 = StringSaver::save((StringSaver *)Src.Length,S);
          local_e8 = SVar3.Data;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e8);
          Token.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
          super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
          super_SmallVectorBase.Size = 0;
          iVar2 = 0;
          if (((char)local_dc != '\0') && (iVar2 = 0, C == '\n')) {
LAB_001320c4:
            local_e8 = (char *)0x0;
            SmallVectorTemplateBase<const_char_*,_true>::push_back
                      ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_e8);
            iVar2 = 0;
          }
          goto LAB_0013214b;
        }
LAB_001320fe:
        if (uVar1 == 0x22) goto LAB_00132134;
      }
LAB_00132104:
      if (C == 0x5c) {
        Src_01.Length = Src_local.Length;
        Src_01.Data = Src_local.Data;
        Index = (char *)parseBackslash(Src_01,(size_t)Index,&Token);
      }
      else {
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)&Token,&C);
      }
LAB_00132147:
      iVar2 = 1;
    }
    else if (iVar2 == 0) {
      if (0x22 < (byte)C) goto LAB_00132104;
      if ((0x100002600U >> (uVar1 & 0x3f) & 1) == 0) goto LAB_001320fe;
      iVar2 = 0;
      if (C == 10 && (char)NewArgv == '\x01') goto LAB_001320c4;
    }
    else {
      if (C == 0x22) goto LAB_00132147;
      if (C == 0x5c) {
        Src_00.Length = Src_local.Length;
        Src_00.Data = Src_local.Data;
        Index = (char *)parseBackslash(Src_00,(size_t)Index,&Token);
      }
      else {
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)&Token,&C);
      }
LAB_00132134:
      iVar2 = 2;
    }
LAB_0013214b:
    Index = Index + 1;
  } while( true );
}

Assistant:

void cl::TokenizeWindowsCommandLine(StringRef Src, StringSaver &Saver,
                                    SmallVectorImpl<const char *> &NewArgv,
                                    bool MarkEOLs) {
  SmallString<128> Token;

  // This is a small state machine to consume characters until it reaches the
  // end of the source string.
  enum { INIT, UNQUOTED, QUOTED } State = INIT;
  for (size_t I = 0, E = Src.size(); I != E; ++I) {
    char C = Src[I];

    // INIT state indicates that the current input index is at the start of
    // the string or between tokens.
    if (State == INIT) {
      if (isWhitespace(C)) {
        // Mark the end of lines in response files
        if (MarkEOLs && C == '\n')
          NewArgv.push_back(nullptr);
        continue;
      }
      if (C == '"') {
        State = QUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        State = UNQUOTED;
        continue;
      }
      Token.push_back(C);
      State = UNQUOTED;
      continue;
    }

    // UNQUOTED state means that it's reading a token not quoted by double
    // quotes.
    if (State == UNQUOTED) {
      // Whitespace means the end of the token.
      if (isWhitespace(C)) {
        NewArgv.push_back(Saver.save(StringRef(Token)).data());
        Token.clear();
        State = INIT;
        // Mark the end of lines in response files
        if (MarkEOLs && C == '\n')
          NewArgv.push_back(nullptr);
        continue;
      }
      if (C == '"') {
        State = QUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        continue;
      }
      Token.push_back(C);
      continue;
    }

    // QUOTED state means that it's reading a token quoted by double quotes.
    if (State == QUOTED) {
      if (C == '"') {
        State = UNQUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        continue;
      }
      Token.push_back(C);
    }
  }
  // Append the last token after hitting EOF with no whitespace.
  if (!Token.empty())
    NewArgv.push_back(Saver.save(StringRef(Token)).data());
  // Mark the end of response files
  if (MarkEOLs)
    NewArgv.push_back(nullptr);
}